

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cc
# Opt level: O3

void brotli::WriteHuffmanTree
               (uint8_t *depth,size_t length,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *tree,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *extra_bits_data)

{
  uint8_t *puVar1;
  uint8_t value;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint8_t previous_value;
  ulong uVar8;
  ulong uVar9;
  size_t repetitions;
  size_t sVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar11 = length;
  if (length == 0) {
    return;
  }
LAB_001817fc:
  if (depth[uVar11 - 1] == '\0') goto code_r0x00181804;
  if (0x32 < length) {
    if (uVar11 != 0) {
      lVar5 = 1;
      uVar7 = 0;
      uVar6 = 0;
      lVar3 = 1;
      uVar8 = 0;
      do {
        puVar1 = depth + uVar6;
        uVar4 = 1;
        uVar9 = uVar6 + 1;
        if (uVar6 + 1 < uVar11) {
          uVar9 = uVar4;
          do {
            uVar4 = uVar9;
            if (depth[uVar9 + uVar6] != *puVar1) break;
            uVar9 = uVar9 + 1;
            uVar4 = uVar11 - uVar6;
          } while (uVar11 - uVar6 != uVar9);
          uVar9 = uVar6 + uVar4;
        }
        uVar6 = uVar9;
        bVar12 = *puVar1 == '\0';
        lVar3 = lVar3 + (ulong)(bVar12 && 2 < uVar4);
        uVar9 = 0;
        if (bVar12 && 2 < uVar4) {
          uVar9 = uVar4;
        }
        uVar7 = uVar7 + uVar9;
        uVar9 = uVar4;
        if (3 >= uVar4 || bVar12) {
          uVar9 = 0;
        }
        uVar8 = uVar8 + uVar9;
        lVar5 = lVar5 + (ulong)(3 < uVar4 && !bVar12);
      } while (uVar6 < uVar11);
      uVar6 = lVar5 * 2;
      uVar4 = lVar3 * 2;
      goto LAB_001818dc;
    }
    goto LAB_001818cb;
  }
  bVar12 = false;
  bVar2 = false;
  goto LAB_00181900;
code_r0x00181804:
  uVar11 = uVar11 - 1;
  if (uVar11 == 0) goto code_r0x00181809;
  goto LAB_001817fc;
code_r0x00181809:
  if (0x32 < length) {
LAB_001818cb:
    uVar4 = 2;
    uVar11 = 0;
    uVar8 = 0;
    uVar6 = 2;
    uVar7 = 0;
LAB_001818dc:
    bVar12 = uVar6 < uVar8;
    bVar2 = uVar4 < uVar7;
LAB_00181900:
    if (uVar11 != 0) {
      previous_value = '\b';
      uVar7 = 0;
      do {
        value = depth[uVar7];
        repetitions = 1;
        if (value == '\0') {
          if (bVar2) goto LAB_0018192c;
LAB_00181974:
          WriteHuffmanTreeRepetitionsZeros(repetitions,tree,extra_bits_data);
        }
        else {
          if (bVar12) {
LAB_0018192c:
            sVar10 = repetitions;
            if (uVar7 + 1 < uVar11) {
              do {
                sVar10 = repetitions;
                if (depth[repetitions + uVar7] != value) break;
                repetitions = repetitions + 1;
                sVar10 = uVar11 - uVar7;
              } while (uVar11 - uVar7 != repetitions);
            }
            repetitions = sVar10;
            if (value == '\0') goto LAB_00181974;
          }
          WriteHuffmanTreeRepetitions(previous_value,value,repetitions,tree,extra_bits_data);
          previous_value = value;
        }
        uVar7 = uVar7 + repetitions;
      } while (uVar7 < uVar11);
    }
  }
  return;
}

Assistant:

void WriteHuffmanTree(const uint8_t* depth,
                      size_t length,
                      std::vector<uint8_t> *tree,
                      std::vector<uint8_t> *extra_bits_data) {
  uint8_t previous_value = 8;

  // Throw away trailing zeros.
  size_t new_length = length;
  for (size_t i = 0; i < length; ++i) {
    if (depth[length - i - 1] == 0) {
      --new_length;
    } else {
      break;
    }
  }

  // First gather statistics on if it is a good idea to do rle.
  bool use_rle_for_non_zero = false;
  bool use_rle_for_zero = false;
  if (length > 50) {
    // Find rle coding for longer codes.
    // Shorter codes seem not to benefit from rle.
    DecideOverRleUse(depth, new_length,
                     &use_rle_for_non_zero, &use_rle_for_zero);
  }

  // Actual rle coding.
  for (size_t i = 0; i < new_length;) {
    const uint8_t value = depth[i];
    size_t reps = 1;
    if ((value != 0 && use_rle_for_non_zero) ||
        (value == 0 && use_rle_for_zero)) {
      for (size_t k = i + 1; k < new_length && depth[k] == value; ++k) {
        ++reps;
      }
    }
    if (value == 0) {
      WriteHuffmanTreeRepetitionsZeros(reps, tree, extra_bits_data);
    } else {
      WriteHuffmanTreeRepetitions(previous_value,
                                  value, reps, tree, extra_bits_data);
      previous_value = value;
    }
    i += reps;
  }
}